

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_serialize_field
          (t_php_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  uint uVar3;
  t_type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *psVar5;
  ostream *poVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [12];
  string local_238;
  t_base local_214;
  undefined1 local_210 [4];
  t_base tbase_1;
  undefined1 local_1e9;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  t_base local_c4;
  undefined1 local_c0 [4];
  t_base tbase;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  t_struct *local_30;
  t_type *type;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  type = (t_type *)prefix;
  prefix_local = (string *)tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  type_00 = t_field::get_type(tfield);
  local_30 = (t_struct *)t_generator::get_true_type(type_00);
  uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
        if (((uVar3 & 1) == 0) &&
           (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar3 & 1) == 0)) {
          uVar7 = std::__cxx11::string::c_str();
          t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          uVar8 = std::__cxx11::string::c_str();
          (*(local_30->super_t_type).super_t_doc._vptr_t_doc[3])();
          uVar9 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",uVar7,uVar8,uVar9);
        }
        else {
          psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0,prefix,psVar5);
          if ((this->binary_inline_ & 1U) == 0) {
            poVar6 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
            std::operator<<(poVar6,"$xfer += $output->");
            uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
            if ((uVar3 & 1) == 0) {
              uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])();
              if ((uVar3 & 1) != 0) {
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI32($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
              }
            }
            else {
              local_214 = t_base_type::get_base((t_base_type *)local_30);
              switch(local_214) {
              case TYPE_VOID:
                pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __cxa_allocate_exception(0x20);
                std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0);
                __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              case TYPE_STRING:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeString($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_BOOL:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeBool($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I8:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeByte($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I16:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI16($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I32:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI32($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I64:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI64($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_DOUBLE:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeDouble($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                std::operator<<(poVar6,");");
                break;
              default:
                auVar10 = __cxa_allocate_exception(0x20);
                t_base_type::t_base_name_abi_cxx11_
                          (&local_238,(t_base_type *)(ulong)local_214,auVar10._8_4_);
                std::operator+(auVar10._0_8_,"compiler error: no PHP name for base type ",&local_238
                              );
                __cxa_throw(auVar10._0_8_,&std::__cxx11::string::typeinfo,
                            std::__cxx11::string::~string);
              }
            }
            std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
          }
          else {
            uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
            if ((uVar3 & 1) == 0) {
              uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])();
              ptVar2 = tfield_local;
              if ((uVar3 & 1) != 0) {
                t_generator::indent_abi_cxx11_((string *)local_210,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)local_210);
                poVar6 = std::operator<<(poVar6,"$output .= pack(\'N\', $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6,");");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)local_210);
              }
            }
            else {
              local_c4 = t_base_type::get_base((t_base_type *)local_30);
              ptVar2 = tfield_local;
              switch(local_c4) {
              case TYPE_VOID:
                pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __cxa_allocate_exception(0x20);
                std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0);
                __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              case TYPE_STRING:
                t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_e8);
                poVar6 = std::operator<<(poVar6,"$output .= pack(\'N\', strlen($");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6,"));");
                poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
                poVar6 = std::operator<<(poVar6,(string *)&local_108);
                poVar6 = std::operator<<(poVar6,"$output .= $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6,";");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_e8);
                break;
              case TYPE_BOOL:
                t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_128);
                poVar6 = std::operator<<(poVar6,"$output .= pack(\'c\', $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6," ? 1 : 0);");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)&local_128);
                break;
              case TYPE_I8:
                t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_148);
                poVar6 = std::operator<<(poVar6,"$output .= pack(\'c\', $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6,");");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)&local_148);
                break;
              case TYPE_I16:
                t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_168);
                poVar6 = std::operator<<(poVar6,"$output .= pack(\'n\', $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6,");");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)&local_168);
                break;
              case TYPE_I32:
                t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_188);
                poVar6 = std::operator<<(poVar6,"$output .= pack(\'N\', $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6,");");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)&local_188);
                break;
              case TYPE_I64:
                t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_1a8);
                poVar6 = std::operator<<(poVar6,"$output .= pack(\'N2\', $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6," >> 32, $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6," & 0xFFFFFFFF);");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)&local_1a8);
                break;
              case TYPE_DOUBLE:
                t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
                poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_1c8);
                poVar6 = std::operator<<(poVar6,"$output .= strrev(pack(\'d\', $");
                poVar6 = std::operator<<(poVar6,(string *)local_c0);
                poVar6 = std::operator<<(poVar6,"));");
                std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
                std::__cxx11::string::~string((string *)&local_1c8);
                break;
              default:
                local_1e9 = 1;
                auVar10 = __cxa_allocate_exception(0x20);
                t_base_type::t_base_name_abi_cxx11_
                          (&local_1e8,(t_base_type *)(ulong)local_c4,auVar10._8_4_);
                std::operator+(auVar10._0_8_,"compiler error: no PHP name for base type ",&local_1e8
                              );
                local_1e9 = 0;
                __cxa_throw(auVar10._0_8_,&std::__cxx11::string::typeinfo,
                            std::__cxx11::string::~string);
              }
            }
          }
          std::__cxx11::string::~string((string *)local_c0);
        }
      }
      else {
        psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&name.field_2 + 8);
        std::operator+(pbVar4,prefix,psVar5);
        generate_serialize_container(this,(ostream *)ptVar2,&ptVar1->super_t_type,pbVar4);
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      }
    }
    else {
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
      std::operator+(&local_80,prefix,psVar5);
      generate_serialize_struct(this,(ostream *)ptVar2,ptVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    return;
  }
  local_5d = 1;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_50,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
  psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
  std::operator+(pbVar4,&local_50,psVar5);
  local_5d = 0;
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_php_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_base_type() || type->is_enum()) {

    string name = prefix + tfield->get_name();

    if (binary_inline_) {
      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
        case t_base_type::TYPE_VOID:
          throw "compiler error: cannot serialize void field in a struct: " + name;
          break;
        case t_base_type::TYPE_STRING:
          out << indent() << "$output .= pack('N', strlen($" << name << "));" << endl << indent()
              << "$output .= $" << name << ";" << endl;
          break;
        case t_base_type::TYPE_BOOL:
          out << indent() << "$output .= pack('c', $" << name << " ? 1 : 0);" << endl;
          break;
        case t_base_type::TYPE_I8:
          out << indent() << "$output .= pack('c', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I16:
          out << indent() << "$output .= pack('n', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I32:
          out << indent() << "$output .= pack('N', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I64:
          out << indent() << "$output .= pack('N2', $" << name << " >> 32, $" << name
              << " & 0xFFFFFFFF);" << endl;
          break;
        case t_base_type::TYPE_DOUBLE:
          out << indent() << "$output .= strrev(pack('d', $" << name << "));" << endl;
          break;
        default:
          throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
        }
      } else if (type->is_enum()) {
        out << indent() << "$output .= pack('N', $" << name << ");" << endl;
      }
    } else {

      indent(out) << "$xfer += $output->";

      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
        case t_base_type::TYPE_VOID:
          throw "compiler error: cannot serialize void field in a struct: " + name;
          break;
        case t_base_type::TYPE_STRING:
          out << "writeString($" << name << ");";
          break;
        case t_base_type::TYPE_BOOL:
          out << "writeBool($" << name << ");";
          break;
        case t_base_type::TYPE_I8:
          out << "writeByte($" << name << ");";
          break;
        case t_base_type::TYPE_I16:
          out << "writeI16($" << name << ");";
          break;
        case t_base_type::TYPE_I32:
          out << "writeI32($" << name << ");";
          break;
        case t_base_type::TYPE_I64:
          out << "writeI64($" << name << ");";
          break;
        case t_base_type::TYPE_DOUBLE:
          out << "writeDouble($" << name << ");";
          break;
        default:
          throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
        }
      } else if (type->is_enum()) {
        out << "writeI32($" << name << ");";
      }
      out << endl;
    }
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}